

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_formats.c
# Opt level: O0

int is_all_static_array_dimens(char *str)

{
  char *str_00;
  char *in_RDI;
  char *end;
  char *left_paren;
  char *local_20;
  int local_4;
  
  str_00 = strchr(in_RDI,0x5b);
  if (str_00 == (char *)0x0) {
    local_4 = 1;
  }
  else {
    strtol(str_00 + 1,&local_20,0);
    if (*local_20 == ']') {
      local_4 = is_all_static_array_dimens(str_00);
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static int
is_all_static_array_dimens(const char *str)
{
    char *left_paren, *end;

    if ((left_paren = strchr(str, '[')) == NULL) {
	return 1;
    }	
    (void) strtol(left_paren + 1, &end, 0);
    if (*end != ']') {
	return 0;
    } else {
	return is_all_static_array_dimens(end+1);
    }
}